

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-attach-file.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  int iVar2;
  exception *e;
  string local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  char *local_58;
  char *next;
  char *arg;
  int i;
  anon_class_1_0_00000001 check_arg;
  char *mimetype;
  char *outfilename;
  char *attachment;
  char *password;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  password = (char *)0x0;
  attachment = (char *)0x0;
  outfilename = (char *)0x0;
  mimetype = (char *)0x0;
  _i = (char *)0x0;
  for (arg._0_4_ = 1; (int)arg < argc; arg._0_4_ = (int)arg + 1) {
    next = argv[(int)arg];
    local_58 = argv[(int)arg + 1];
    iVar2 = strcmp(next,"--infile");
    pcVar1 = local_58;
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"--infile takes an argument",&local_79);
      main::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&arg + 7),pcVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      password = local_58;
      arg._0_4_ = (int)arg + 1;
    }
    else {
      iVar2 = strcmp(next,"--password");
      pcVar1 = local_58;
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"--password takes an argument",&local_b1);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&arg + 7),pcVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
        attachment = local_58;
        arg._0_4_ = (int)arg + 1;
      }
      else {
        iVar2 = strcmp(next,"--attachment");
        pcVar1 = local_58;
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"--attachment takes an argument",&local_d9);
          main::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&arg + 7),pcVar1,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          outfilename = local_58;
          arg._0_4_ = (int)arg + 1;
        }
        else {
          iVar2 = strcmp(next,"--outfile");
          pcVar1 = local_58;
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"--outfile takes an argument",&local_101);
            main::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&arg + 7),pcVar1,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::allocator<char>::~allocator(&local_101);
            mimetype = local_58;
            arg._0_4_ = (int)arg + 1;
          }
          else {
            iVar2 = strcmp(next,"--mimetype");
            __s = next;
            pcVar1 = local_58;
            if (iVar2 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"--mimetype takes an argument",&local_129);
              main::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&arg + 7),pcVar1,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::allocator<char>::~allocator(&local_129);
              _i = local_58;
              arg._0_4_ = (int)arg + 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_170,__s,&local_171);
              std::operator+(&local_150,"unknown argument ",&local_170);
              usage(&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_170);
              std::allocator<char>::~allocator(&local_171);
            }
          }
        }
      }
    }
  }
  if (((password == (char *)0x0) || (outfilename == (char *)0x0)) || (mimetype == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"required arguments were not provided",
               (allocator<char> *)((long)&e + 7));
    usage(&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  }
  process(password,attachment,outfilename,_i,mimetype);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* password = nullptr;
    char const* attachment = nullptr;
    char const* outfilename = nullptr;
    char const* mimetype = nullptr;

    auto check_arg = [](char const* arg, std::string const& msg) {
        if (arg == nullptr) {
            usage(msg);
        }
    };

    for (int i = 1; i < argc; ++i) {
        char* arg = argv[i];
        char* next = argv[i + 1];
        if (strcmp(arg, "--infile") == 0) {
            check_arg(next, "--infile takes an argument");
            infilename = next;
            ++i;
        } else if (strcmp(arg, "--password") == 0) {
            check_arg(next, "--password takes an argument");
            password = next;
            ++i;
        } else if (strcmp(arg, "--attachment") == 0) {
            check_arg(next, "--attachment takes an argument");
            attachment = next;
            ++i;
        } else if (strcmp(arg, "--outfile") == 0) {
            check_arg(next, "--outfile takes an argument");
            outfilename = next;
            ++i;
        } else if (strcmp(arg, "--mimetype") == 0) {
            check_arg(next, "--mimetype takes an argument");
            mimetype = next;
            ++i;
        } else {
            usage("unknown argument " + std::string(arg));
        }
    }
    if (!(infilename && attachment && outfilename)) {
        usage("required arguments were not provided");
    }

    try {
        process(infilename, password, attachment, mimetype, outfilename);
    } catch (std::exception& e) {
        std::cerr << whoami << " exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}